

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O1

Vector<double,_3> * tcu::cross<double,3>(Vector<double,_3> *a,Vector<double,_3> *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Vector<double,_3> *in_RDI;
  
  dVar1 = a->m_data[0];
  dVar2 = a->m_data[1];
  dVar3 = b->m_data[2];
  dVar4 = b->m_data[0];
  dVar5 = b->m_data[1];
  dVar6 = a->m_data[2];
  in_RDI->m_data[0] = dVar2 * dVar3 - dVar6 * dVar5;
  in_RDI->m_data[1] = dVar6 * dVar4 - dVar3 * dVar1;
  in_RDI->m_data[2] = dVar1 * dVar5 - dVar2 * dVar4;
  return in_RDI;
}

Assistant:

inline Vector<T, Size> cross (const Vector<T, Size>& a, const Vector<T, Size>& b)
{
	DE_STATIC_ASSERT(Size == 3);
	return Vector<T, Size>(
		a.y() * b.z() - b.y() * a.z(),
		a.z() * b.x() - b.z() * a.x(),
		a.x() * b.y() - b.x() * a.y());
}